

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::resetAuxDegrees(Graph *this)

{
  int iVar1;
  Vertex *this_00;
  Vertex *this_01;
  Vertex *dest;
  Vertex *orig;
  Edge *e;
  Vertex *v;
  Graph *this_local;
  
  for (e = (Edge *)this->verticesList; e != (Edge *)0x0; e = (Edge *)Vertex::getNext((Vertex *)e)) {
    for (orig = (Vertex *)Vertex::getEdgesList((Vertex *)e); orig != (Vertex *)0x0;
        orig = (Vertex *)Edge::getNext((Edge *)orig)) {
      this_00 = Edge::getOrigin((Edge *)orig);
      this_01 = Edge::getDestiny((Edge *)orig);
      iVar1 = Vertex::getOutdegree(this_00);
      Vertex::setAuxDegree(this_00,iVar1);
      iVar1 = Vertex::getOutdegree(this_01);
      Vertex::setAuxDegree(this_01,iVar1);
    }
  }
  return;
}

Assistant:

void Graph::resetAuxDegrees(){
    for(Vertex *v = this->verticesList; v!=NULL; v = v->getNext()){
        for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){
            Vertex *orig, *dest;
            orig = e->getOrigin();
            dest = e->getDestiny();

            orig->setAuxDegree(orig->getOutdegree());
            dest->setAuxDegree(dest->getOutdegree());
        }
    }
}